

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putcontig8bitYCbCr21tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  byte bVar2;
  TIFFRGBAImage *pTVar3;
  uint uVar4;
  uint32_t g;
  uint32_t local_60;
  uint32_t local_5c;
  uint local_58;
  uint32_t local_54;
  uint local_50;
  uint32_t local_4c;
  TIFFRGBAImage *local_48;
  long local_40;
  long local_38;
  
  local_38 = (long)toskew;
  local_50 = w >> 1;
  local_40 = (long)(int)((fromskew - (fromskew >> 0x1f)) * 2 & 0xfffffffc);
  local_4c = w;
  local_48 = img;
  do {
    uVar4 = local_50;
    local_54 = h;
    if (1 < w) {
      do {
        pTVar3 = local_48;
        bVar1 = pp[2];
        bVar2 = pp[3];
        TIFFYCbCrtoRGB(local_48->ycbcr,(uint)*pp,(uint)bVar1,(uint)bVar2,&local_58,&local_5c,
                       &local_60);
        *cp = local_60 << 0x10 | 0xff000000 | local_5c << 8 | local_58;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&local_58,&local_5c,
                       &local_60);
        cp[1] = local_60 << 0x10 | 0xff000000 | local_5c << 8 | local_58;
        cp = cp + 2;
        pp = pp + 4;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    w = local_4c;
    if ((local_4c & 1) != 0) {
      TIFFYCbCrtoRGB(local_48->ycbcr,(uint)*pp,(uint)pp[2],(uint)pp[3],&local_58,&local_5c,&local_60
                    );
      *cp = local_5c << 8 | local_58 | local_60 << 0x10 | 0xff000000;
      cp = cp + 1;
      pp = pp + 4;
    }
    pp = pp + local_40;
    cp = cp + local_38;
    h = local_54 - 1;
  } while (h != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr21tile)
{
    (void)y;
    fromskew = (fromskew / 2) * (2 * 1 + 2);
    do
    {
        x = w >> 1;
        while (x > 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);

            cp += 2;
            pp += 4;
            x--;
        }

        if ((w & 1) != 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);

            cp += 1;
            pp += 4;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}